

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O3

void __thiscall mario::TimerQueue::cancelInLoop(TimerQueue *this,TimerId timerId)

{
  void *pvVar1;
  iterator __position;
  pair<std::_Rb_tree_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::_Rb_tree_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  pVar2;
  ActiveTimer timer;
  key_type local_38;
  key_type local_28;
  
  EventLoop::assertInLoopThread(this->_loop);
  local_38.first = timerId._value;
  local_38.second = timerId._seq;
  __position = std::
               _Rb_tree<std::pair<mario::Timer_*,_long>,_std::pair<mario::Timer_*,_long>,_std::_Identity<std::pair<mario::Timer_*,_long>_>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
               ::find(&(this->_activeTimers)._M_t,&local_38);
  if ((_Rb_tree_header *)__position._M_node ==
      &(this->_activeTimers)._M_t._M_impl.super__Rb_tree_header) {
    if (this->_callingExpiredTimers == true) {
      std::
      _Rb_tree<std::pair<mario::Timer*,long>,std::pair<mario::Timer*,long>,std::_Identity<std::pair<mario::Timer*,long>>,std::less<std::pair<mario::Timer*,long>>,std::allocator<std::pair<mario::Timer*,long>>>
      ::_M_insert_unique<std::pair<mario::Timer*,long>const&>
                ((_Rb_tree<std::pair<mario::Timer*,long>,std::pair<mario::Timer*,long>,std::_Identity<std::pair<mario::Timer*,long>>,std::less<std::pair<mario::Timer*,long>>,std::allocator<std::pair<mario::Timer*,long>>>
                  *)&this->_cancelingTimers,&local_38);
    }
  }
  else {
    local_28.second = *(Timer **)(__position._M_node + 1);
    local_28.first._microSecondsSinceEpoch =
         ((local_28.second)->_expiration)._microSecondsSinceEpoch;
    pVar2 = std::
            _Rb_tree<std::pair<mario::Timestamp,_mario::Timer_*>,_std::pair<mario::Timestamp,_mario::Timer_*>,_std::_Identity<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
            ::equal_range(&(this->_timers)._M_t,&local_28);
    std::
    _Rb_tree<std::pair<mario::Timestamp,_mario::Timer_*>,_std::pair<mario::Timestamp,_mario::Timer_*>,_std::_Identity<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
    ::_M_erase_aux(&(this->_timers)._M_t,(_Base_ptr)pVar2.first._M_node,
                   (_Base_ptr)pVar2.second._M_node);
    pvVar1 = *(void **)(__position._M_node + 1);
    if ((pvVar1 != (void *)0x0) && (*(code **)((long)pvVar1 + 0x10) != (code *)0x0)) {
      (**(code **)((long)pvVar1 + 0x10))(pvVar1,pvVar1,3);
    }
    operator_delete(pvVar1);
    std::
    _Rb_tree<std::pair<mario::Timer*,long>,std::pair<mario::Timer*,long>,std::_Identity<std::pair<mario::Timer*,long>>,std::less<std::pair<mario::Timer*,long>>,std::allocator<std::pair<mario::Timer*,long>>>
    ::erase_abi_cxx11_((_Rb_tree<std::pair<mario::Timer*,long>,std::pair<mario::Timer*,long>,std::_Identity<std::pair<mario::Timer*,long>>,std::less<std::pair<mario::Timer*,long>>,std::allocator<std::pair<mario::Timer*,long>>>
                        *)&this->_activeTimers,(const_iterator)__position._M_node);
  }
  return;
}

Assistant:

void TimerQueue::cancelInLoop(TimerId timerId) {
    _loop->assertInLoopThread();
    ActiveTimer timer(timerId._value, timerId._seq);
    auto it = _activeTimers.find(timer);
    if (it != _activeTimers.end()) {
        size_t n = _timers.erase(Entry(it->first->expiration(), it->first));
        delete it->first;
        _activeTimers.erase(it);
    } else if (_callingExpiredTimers) {
        // 自cancel逻辑
        _cancelingTimers.insert(timer);
    }
}